

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  char *pcVar2;
  FilePath *in_RDI;
  char cwd [4097];
  allocator local_1039;
  string local_1038;
  char local_1018 [4104];
  
  memset(local_1018,0,0x1001);
  pcVar1 = getcwd(local_1018,0x1001);
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = local_1018;
  }
  std::__cxx11::string::string((string *)&local_1038,pcVar2,&local_1039);
  FilePath(in_RDI,&local_1038);
  std::__cxx11::string::~string((string *)&local_1038);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if defined(GTEST_OS_WINDOWS_MOBILE) || defined(GTEST_OS_WINDOWS_PHONE) || \
    defined(GTEST_OS_WINDOWS_RT) || defined(GTEST_OS_ESP8266) ||           \
    defined(GTEST_OS_ESP32) || defined(GTEST_OS_XTENSA) ||                 \
    defined(GTEST_OS_QURT) || defined(GTEST_OS_NXP_QN9090) ||              \
    defined(GTEST_OS_NRF52)
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif defined(GTEST_OS_WINDOWS)
  char cwd[GTEST_PATH_MAX_ + 1] = {'\0'};
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = {'\0'};
  char* result = getcwd(cwd, sizeof(cwd));
#ifdef GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
#endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}